

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[12],pstack::Dwarf::LineInfo,char>
          (JObject *this,char (*k) [12],LineInfo *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[12],_pstack::Dwarf::LineInfo>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[12],_pstack::Dwarf::LineInfo> field;
  char *c_local;
  LineInfo *v_local;
  char (*k_local) [12];
  JObject *this_local;
  
  field.v = (LineInfo *)c;
  Field<char[12],_pstack::Dwarf::LineInfo>::Field
            ((Field<char[12],_pstack::Dwarf::LineInfo> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[12],pstack::Dwarf::LineInfo>,char>
                       ((Field<char[12],_pstack::Dwarf::LineInfo> *)local_38,
                        &(field.v)->default_is_stmt);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }